

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

bool Js::JavascriptStackWalker::TryIsTopJavaScriptFrameNative
               (ScriptContext *scriptContext,bool *isNative,bool ignoreLibraryCode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InterpreterStackFrame *pIVar4;
  int local_dc;
  undefined1 local_d8 [4];
  BOOL isSuccess;
  JavascriptStackWalker walker;
  JavascriptFunction *caller;
  bool ignoreLibraryCode_local;
  bool *isNative_local;
  ScriptContext *scriptContext_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4cc,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (isNative == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4cd,"(isNative)","isNative");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  JavascriptStackWalker((JavascriptStackWalker *)local_d8,scriptContext,true,(PVOID)0x0,false);
  if (ignoreLibraryCode) {
    local_dc = GetNonLibraryCodeCaller
                         ((JavascriptStackWalker *)local_d8,
                          (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight);
  }
  else {
    local_dc = GetCaller((JavascriptStackWalker *)local_d8,
                         (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
  }
  if (local_dc != 0) {
    pIVar4 = GetCurrentInterpreterFrame((JavascriptStackWalker *)local_d8);
    *isNative = pIVar4 == (InterpreterStackFrame *)0x0;
  }
  ~JavascriptStackWalker((JavascriptStackWalker *)local_d8);
  return local_dc != 0;
}

Assistant:

bool JavascriptStackWalker::TryIsTopJavaScriptFrameNative(ScriptContext* scriptContext, bool* isNative, bool ignoreLibraryCode /* = false */)
    {
        Assert(scriptContext);
        Assert(isNative);

        Js::JavascriptFunction* caller;
        Js::JavascriptStackWalker walker(scriptContext);

        BOOL isSuccess;
        if (ignoreLibraryCode)
        {
            isSuccess = walker.GetNonLibraryCodeCaller(&caller);
        }
        else
        {
            isSuccess = walker.GetCaller(&caller);
        }

        if (isSuccess)
        {
            *isNative = (walker.GetCurrentInterpreterFrame() == NULL);
            return true;
        }
        return false;
    }